

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
               (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                begin,__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                      end,
               __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
               out,comm *comm)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  reference msgs;
  reference out_00;
  undefined1 local_110 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  size_t nsend;
  size_t left_to_send;
  undefined1 local_d8 [4];
  int first_p;
  block_decomposition<unsigned_long> part;
  allocator<unsigned_long> local_a9;
  value_type_conflict local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  size_t prefix;
  size_t total_size;
  unsigned_long local_50;
  size_t local_size;
  comm *local_40;
  TwoBSA<unsigned_long> *local_38;
  TwoBSA<unsigned_long> *local_30;
  comm *local_28;
  comm *comm_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  out_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  end_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  begin_local;
  
  local_28 = comm;
  comm_local = (comm *)out._M_current;
  out_local = end;
  end_local = begin;
  iVar2 = mxx::comm::size(comm);
  if (iVar2 == 1) {
    local_30 = end_local._M_current;
    local_38 = out_local._M_current;
    local_40 = comm_local;
    std::
    copy<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
              (end_local,out_local,
               (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                )comm_local);
  }
  else {
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                         (end_local,out_local);
    uVar4 = allreduce<unsigned_long>(&local_50,local_28);
    if (uVar4 != 0) {
      bVar1 = any_of(local_50 == uVar4,local_28);
      if (bVar1) {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                  (end_local,out_local,
                   (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                    )comm_local,uVar4,local_28);
      }
      else {
        send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)exscan<unsigned_long>(&local_50,local_28);
        iVar2 = mxx::comm::size(local_28);
        local_a8 = 0;
        std::allocator<unsigned_long>::allocator(&local_a9);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,(long)iVar2,
                   &local_a8,&local_a9);
        std::allocator<unsigned_long>::~allocator(&local_a9);
        iVar2 = mxx::comm::size(local_28);
        iVar3 = mxx::comm::rank(local_28);
        partition::block_decomposition<unsigned_long>::block_decomposition
                  ((block_decomposition<unsigned_long> *)local_d8,uVar4,iVar2,iVar3);
        left_to_send._4_4_ =
             partition::block_decomposition<unsigned_long>::target_processor
                       ((block_decomposition<unsigned_long> *)local_d8,
                        (unsigned_long)
                        send_counts.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        nsend = local_50;
        while( true ) {
          iVar2 = left_to_send._4_4_;
          bVar1 = false;
          if (nsend != 0) {
            iVar3 = mxx::comm::size(local_28);
            bVar1 = iVar2 < iVar3;
          }
          if (!bVar1) break;
          uVar4 = partition::block_decomposition<unsigned_long>::prefix_size
                            ((block_decomposition<unsigned_long> *)local_d8,left_to_send._4_4_);
          recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(uVar4 - (long)send_counts.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          puVar5 = std::min<unsigned_long>
                             ((unsigned_long *)
                              &recv_counts.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&nsend);
          uVar4 = *puVar5;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                              (long)left_to_send._4_4_);
          *pvVar6 = uVar4;
          nsend = nsend - uVar4;
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(uVar4 + (long)send_counts.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          left_to_send._4_4_ = left_to_send._4_4_ + 1;
        }
        all2all<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,local_28);
        msgs = __gnu_cxx::
               __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
               ::operator*(&end_local);
        out_00 = __gnu_cxx::
                 __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                 ::operator*((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                              *)&comm_local);
        all2allv<TwoBSA<unsigned_long>>
                  (msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,out_00,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,local_28);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110);
        partition::block_decomposition<unsigned_long>::~block_decomposition
                  ((block_decomposition<unsigned_long> *)local_d8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    std::size_t local_size = std::distance(begin, end);
    std::size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        std::size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        std::vector<size_t> send_counts(comm.size(), 0);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        int first_p = part.target_processor(prefix);
        std::size_t left_to_send = local_size;
        for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
            std::size_t nsend = std::min<std::size_t>(part.prefix_size(first_p) - prefix, left_to_send);
            send_counts[first_p] = nsend;
            left_to_send -= nsend;
            prefix += nsend;
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
    }
}